

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_ldc2_w(ExecutionEngine *this)

{
  uchar uVar1;
  uint uVar2;
  u4 uVar3;
  cp_info *pcVar4;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar5;
  cp_info **ppcVar6;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  anon_union_8_10_52016fac_for_data extraout_RDX;
  anon_union_8_10_52016fac_for_data extraout_RDX_00;
  anon_union_8_10_52016fac_for_data aVar10;
  uint uVar11;
  anon_union_8_10_52016fac_for_data aVar12;
  undefined8 uVar13;
  double dVar14;
  Value operand;
  Value operand_00;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar5 = Frame::getCode(this_01,this_01->pc);
  uVar8 = (ulong)(ushort)(*(ushort *)(puVar5 + 1) << 8 | *(ushort *)(puVar5 + 1) >> 8);
  ppcVar6 = Frame::getConstantPool(this_01);
  pcVar4 = *ppcVar6;
  uVar1 = pcVar4[uVar8 - 1].tag;
  uVar2 = pcVar4[uVar8 - 1].info.long_info.high_bytes;
  uVar3 = pcVar4[uVar8 - 1].info.long_info.low_bytes;
  if (uVar1 == '\x06') {
    uVar7 = CONCAT44(uVar2,uVar3);
    uVar11 = uVar2 >> 0x14 & 0x7ff;
    uVar8 = (uVar7 & 0xfffffffffffff) + 0x10000000000000;
    if (uVar11 == 0) {
      uVar8 = uVar7 * 2 & 0x1ffffffffffffe;
    }
    uVar7 = -uVar8;
    if (-1 < (long)((ulong)uVar2 << 0x20)) {
      uVar7 = uVar8;
    }
    dVar14 = ldexp(1.0,uVar11 - 0x433);
    aVar12.doubleValue = dVar14 * (double)(long)uVar7;
    uVar13 = 0x700000000;
    aVar10 = extraout_RDX_00;
  }
  else {
    if (uVar1 != '\x05') {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "ldc2_w tentando acessar um elemento da CP invalido: ");
      poVar9 = std::operator<<(poVar9,uVar1);
      std::endl<char,std::char_traits<char>>(poVar9);
      exit(1);
    }
    aVar12.longValue._4_4_ = uVar2;
    aVar12.intValue = uVar3;
    uVar13 = 0x600000000;
    aVar10 = extraout_RDX;
  }
  operand.data.longValue = aVar10.longValue;
  operand.printType = BOOLEAN;
  operand.type = PADDING;
  Frame::pushIntoOperandStack(this_01,operand);
  operand_00.data.longValue = aVar12.longValue;
  operand_00.printType = (int)uVar13;
  operand_00.type = (int)((ulong)uVar13 >> 0x20);
  Frame::pushIntoOperandStack(this_01,operand_00);
  this_01->pc = this_01->pc + 3;
  return;
}

Assistant:

void ExecutionEngine::i_ldc2_w() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    u2 index = (byte1 << 8) | byte2;
    
    cp_info *classFile = *(topFrame->getConstantPool());
    cp_info entry = classFile[index-1];
    
    Value value;
    
    if (entry.tag == CONSTANT_Long) {
        u4 highBytes = entry.info.long_info.high_bytes;
        u4 lowBytes = entry.info.long_info.low_bytes;
        
        int64_t longNumber = ((int64_t) highBytes << 32) + lowBytes;
        value.type = ValueType::LONG;
        value.data.longValue = longNumber;
        
        Value padding;
        padding.type = ValueType::PADDING;
        
        topFrame->pushIntoOperandStack(padding);
    } else if (entry.tag == CONSTANT_Double) {
        u4 highBytes = entry.info.double_info.high_bytes;
        u4 lowBytes = entry.info.double_info.low_bytes;
        
        int64_t longNumber = ((int64_t) highBytes << 32) + lowBytes;
        
        int32_t s = ((longNumber >> 63) == 0) ? 1 : -1;
        int32_t e = (int32_t)((longNumber >> 52) & 0x7ffL);
        int64_t m = (e == 0) ? (longNumber & 0xfffffffffffffL) << 1 : (longNumber & 0xfffffffffffffL) | 0x10000000000000L;
        
        double doubleNumber = s*m*pow(2, e-1075);
        value.type = ValueType::DOUBLE;
        value.data.doubleValue = doubleNumber;
        
        Value padding;
        padding.type = ValueType::PADDING;
        
        topFrame->pushIntoOperandStack(padding);
    } else {
        cerr << "ldc2_w tentando acessar um elemento da CP invalido: " << entry.tag << endl;
        exit(1);
    }
    
    topFrame->pushIntoOperandStack(value);
    topFrame->pc += 3;
}